

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O0

void __thiscall
IO::writeNicking(IO *this,
                vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                *nicking_arr,string *filename)

{
  bool bVar1;
  reference paVar2;
  iterator pvVar3;
  ostream *poVar4;
  value_type_conflict nicked;
  iterator __end2;
  iterator __begin2;
  array<float,_4UL> *__range2;
  array<float,_4UL> timestep;
  iterator __end1;
  iterator __begin1;
  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *__range1;
  string local_220 [8];
  ofstream outstream;
  string *filename_local;
  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *nicking_arr_local;
  IO *this_local;
  
  std::ofstream::ofstream(local_220);
  std::ofstream::open(local_220,(_Ios_Openmode)filename);
  __end1 = std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::begin
                     (nicking_arr);
  timestep._M_elems._8_8_ =
       std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::end
                 (nicking_arr);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::array<float,_4UL>_*,_std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
                                *)(timestep._M_elems + 2));
    if (!bVar1) break;
    paVar2 = __gnu_cxx::
             __normal_iterator<std::array<float,_4UL>_*,_std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
             ::operator*(&__end1);
    __range2 = *(array<float,_4UL> **)paVar2->_M_elems;
    timestep._M_elems._0_8_ = *(undefined8 *)(paVar2->_M_elems + 2);
    __end2 = std::array<float,_4UL>::begin((array<float,_4UL> *)&__range2);
    pvVar3 = std::array<float,_4UL>::end((array<float,_4UL> *)&__range2);
    for (; __end2 != pvVar3; __end2 = __end2 + 1) {
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_220,*__end2);
      std::operator<<(poVar4,"\t");
    }
    std::ostream::operator<<((ostream *)local_220,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<std::array<float,_4UL>_*,_std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
    ::operator++(&__end1);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_220);
  return;
}

Assistant:

void IO::writeNicking(std::vector<std::array<float, 4>> nicking_arr, std::string filename) {
	std::ofstream outstream;
	outstream.open(filename, std::ios::app);
	for (auto timestep: nicking_arr){
		for (auto nicked:  timestep){
			outstream << nicked << "\t";
		}
		outstream << std::endl;
	}
	outstream.close();
}